

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O2

void av1_init_warp_params
               (InterPredParams *inter_pred_params,WarpTypesAllowed *warp_types,int ref,
               MACROBLOCKD *xd,MB_MODE_INFO *mi)

{
  WarpedMotionParams *pWVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int8_t iVar4;
  undefined2 uVar5;
  int16_t iVar6;
  int16_t iVar7;
  int16_t iVar8;
  int16_t iVar9;
  int iVar10;
  WarpedMotionParams *pWVar11;
  
  if (((7 < inter_pred_params->block_height) && (7 < inter_pred_params->block_width)) &&
     (xd->cur_frame_force_integer_mv == 0)) {
    pWVar11 = xd->global_motion + mi->ref_frame[ref];
    iVar10 = av1_is_scaled(inter_pred_params->scale_factors);
    if (iVar10 == 0) {
      pWVar1 = &inter_pred_params->warp_params;
      (inter_pred_params->warp_params).wmmat[4] = 0;
      (inter_pred_params->warp_params).wmmat[5] = 0x10000;
      (inter_pred_params->warp_params).alpha = 0;
      (inter_pred_params->warp_params).beta = 0;
      (inter_pred_params->warp_params).gamma = 0;
      (inter_pred_params->warp_params).delta = 0;
      (inter_pred_params->warp_params).wmtype = '\0';
      (inter_pred_params->warp_params).invalid = '\0';
      *(undefined2 *)&(inter_pred_params->warp_params).field_0x22 = 0;
      pWVar1->wmmat[0] = 0;
      pWVar1->wmmat[1] = 0;
      (inter_pred_params->warp_params).wmmat[2] = 0x10000;
      (inter_pred_params->warp_params).wmmat[3] = 0;
      if ((warp_types->local_warp_allowed == 0) || ((mi->wm_params).invalid != '\0')) {
        if (warp_types->global_warp_allowed == 0) {
          return;
        }
        if (pWVar11->invalid != '\0') {
          return;
        }
      }
      else {
        pWVar11 = &mi->wm_params;
      }
      iVar4 = pWVar11->invalid;
      uVar5 = *(undefined2 *)&pWVar11->field_0x22;
      (inter_pred_params->warp_params).wmtype = pWVar11->wmtype;
      (inter_pred_params->warp_params).invalid = iVar4;
      *(undefined2 *)&(inter_pred_params->warp_params).field_0x22 = uVar5;
      uVar2 = *(undefined8 *)pWVar11->wmmat;
      uVar3 = *(undefined8 *)(pWVar11->wmmat + 2);
      iVar6 = pWVar11->alpha;
      iVar7 = pWVar11->beta;
      iVar8 = pWVar11->gamma;
      iVar9 = pWVar11->delta;
      *(undefined8 *)((inter_pred_params->warp_params).wmmat + 4) =
           *(undefined8 *)(pWVar11->wmmat + 4);
      (inter_pred_params->warp_params).alpha = iVar6;
      (inter_pred_params->warp_params).beta = iVar7;
      (inter_pred_params->warp_params).gamma = iVar8;
      (inter_pred_params->warp_params).delta = iVar9;
      *(undefined8 *)pWVar1->wmmat = uVar2;
      *(undefined8 *)((inter_pred_params->warp_params).wmmat + 2) = uVar3;
      inter_pred_params->mode = WARP_PRED;
    }
  }
  return;
}

Assistant:

void av1_init_warp_params(InterPredParams *inter_pred_params,
                          const WarpTypesAllowed *warp_types, int ref,
                          const MACROBLOCKD *xd, const MB_MODE_INFO *mi) {
  if (inter_pred_params->block_height < 8 || inter_pred_params->block_width < 8)
    return;

  if (xd->cur_frame_force_integer_mv) return;

  if (allow_warp(mi, warp_types, &xd->global_motion[mi->ref_frame[ref]], 0,
                 inter_pred_params->scale_factors,
                 &inter_pred_params->warp_params)) {
#if CONFIG_REALTIME_ONLY && !CONFIG_AV1_DECODER
    aom_internal_error(xd->error_info, AOM_CODEC_UNSUP_FEATURE,
                       "Warped motion is disabled in realtime only build.");
#endif  // CONFIG_REALTIME_ONLY && !CONFIG_AV1_DECODER
    inter_pred_params->mode = WARP_PRED;
  }
}